

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int local_104;
  undefined1 local_100 [8];
  uv_write_t req;
  size_t req_size;
  size_t written;
  int has_pollout;
  int r;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_stream_t *stream_local;
  
  if ((stream->connect_req == (uv_connect_t *)0x0) && (stream->write_queue_size == 0)) {
    iVar1 = uv__io_active(&stream->io_watcher,4);
    stream_local._4_4_ = uv_write((uv_write_t *)local_100,stream,bufs,nbufs,uv_try_write_cb);
    if (stream_local._4_4_ == 0) {
      sVar2 = uv__count_bufs(bufs,nbufs);
      if (req._104_8_ == 0) {
        req.bufsml[3].len = 0;
      }
      else {
        req.bufsml[3].len = uv__write_req_size((uv_write_t *)local_100);
      }
      lVar3 = sVar2 - req.bufsml[3].len;
      stream->write_queue_size = stream->write_queue_size - req.bufsml[3].len;
      *(uv_stream_t **)req.queue[0] = req.handle;
      (req.handle)->loop = (uv_loop_t *)req.queue[0];
      if ((stream->loop->active_reqs).count == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/stream.c"
                      ,0x601,"int uv_try_write(uv_stream_t *, const uv_buf_t *, unsigned int)");
      }
      (stream->loop->active_reqs).count = (stream->loop->active_reqs).count - 1;
      if ((uint *)req._104_8_ != &req.nbufs) {
        uv__free((void *)req._104_8_);
      }
      req.write_index = 0;
      req._108_4_ = 0;
      if (iVar1 == 0) {
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        uv__stream_osx_interrupt_select(stream);
      }
      if ((lVar3 == 0) && (req.bufsml[3].len != 0)) {
        if (req.bufs._4_4_ < 0) {
          local_104 = req.bufs._4_4_;
        }
        else {
          local_104 = -0xb;
        }
        stream_local._4_4_ = local_104;
      }
      else {
        stream_local._4_4_ = (int)lVar3;
      }
    }
  }
  else {
    stream_local._4_4_ = -0xb;
  }
  return stream_local._4_4_;
}

Assistant:

int uv_try_write(uv_stream_t* stream,
                 const uv_buf_t bufs[],
                 unsigned int nbufs) {
  int r;
  int has_pollout;
  size_t written;
  size_t req_size;
  uv_write_t req;

  /* Connecting or already writing some data */
  if (stream->connect_req != NULL || stream->write_queue_size != 0)
    return UV_EAGAIN;

  has_pollout = uv__io_active(&stream->io_watcher, POLLOUT);

  r = uv_write(&req, stream, bufs, nbufs, uv_try_write_cb);
  if (r != 0)
    return r;

  /* Remove not written bytes from write queue size */
  written = uv__count_bufs(bufs, nbufs);
  if (req.bufs != NULL)
    req_size = uv__write_req_size(&req);
  else
    req_size = 0;
  written -= req_size;
  stream->write_queue_size -= req_size;

  /* Unqueue request, regardless of immediateness */
  QUEUE_REMOVE(&req.queue);
  uv__req_unregister(stream->loop, &req);
  if (req.bufs != req.bufsml)
    uv__free(req.bufs);
  req.bufs = NULL;

  /* Do not poll for writable, if we wasn't before calling this */
  if (!has_pollout) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  if (written == 0 && req_size != 0)
    return req.error < 0 ? req.error : UV_EAGAIN;
  else
    return written;
}